

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjunction_simplification.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ConjunctionSimplificationRule::RemoveExpression
          (ConjunctionSimplificationRule *this,BoundConjunctionExpression *conj,Expression *expr)

{
  Expression *this_00;
  reference pvVar1;
  _func_int **pp_Var2;
  Expression *in_RCX;
  _func_int **pp_Var3;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var4;
  size_type __n;
  
  this_00 = expr + 1;
  pp_Var2 = *(_func_int ***)&expr[1].super_BaseExpression.type;
  pp_Var3 = pp_Var2;
  if (pp_Var2 != expr[1].super_BaseExpression._vptr_BaseExpression) {
    __n = 0;
    do {
      pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                             *)this_00,__n);
      if ((pvVar1->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl == in_RCX) {
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        ::erase_at((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)this_00,__n);
        pp_Var2 = expr[1].super_BaseExpression._vptr_BaseExpression;
        pp_Var3 = *(_func_int ***)&expr[1].super_BaseExpression.type;
        break;
      }
      __n = __n + 1;
      pp_Var2 = expr[1].super_BaseExpression._vptr_BaseExpression;
      pp_Var3 = *(_func_int ***)&expr[1].super_BaseExpression.type;
    } while (__n < (ulong)((long)pp_Var3 - (long)pp_Var2 >> 3));
  }
  if ((long)pp_Var3 - (long)pp_Var2 == 8) {
    pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                           *)this_00,0);
    _Var4._M_head_impl =
         (pvVar1->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar1->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  }
  else {
    _Var4._M_head_impl = (Expression *)0x0;
  }
  (this->super_Rule)._vptr_Rule = (_func_int **)_Var4._M_head_impl;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> ConjunctionSimplificationRule::RemoveExpression(BoundConjunctionExpression &conj,
                                                                       const Expression &expr) {
	for (idx_t i = 0; i < conj.children.size(); i++) {
		if (conj.children[i].get() == &expr) {
			// erase the expression
			conj.children.erase_at(i);
			break;
		}
	}
	if (conj.children.size() == 1) {
		// one expression remaining: simply return that expression and erase the conjunction
		return std::move(conj.children[0]);
	}
	return nullptr;
}